

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O1

uint8_t __thiscall ami_nvar_t::nvar_entry_body_t::extended_header_checksum(nvar_entry_body_t *this)

{
  nvar_attributes_t *pnVar1;
  kstream *this_00;
  uint8_t uVar2;
  uint16_t uVar3;
  nvar_extended_attributes_t *pnVar4;
  uint64_t pos;
  uint64_t uVar5;
  
  if (this->f_extended_header_checksum == false) {
    this->n_extended_header_checksum = true;
    pnVar1 = (this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
    if ((pnVar1->m_valid == true) && (pnVar1->m_extended_header == true)) {
      uVar3 = extended_header_size(this);
      if (3 < uVar3) {
        pnVar4 = extended_header_attributes(this);
        if (pnVar4->m_checksum == true) {
          this->n_extended_header_checksum = false;
          pos = kaitai::kstream::pos((this->super_kstruct).m__io);
          this_00 = (this->super_kstruct).m__io;
          uVar5 = kaitai::kstream::pos(this_00);
          kaitai::kstream::seek(this_00,uVar5 - 3);
          uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
          this->m_extended_header_checksum = uVar2;
          kaitai::kstream::seek((this->super_kstruct).m__io,pos);
          this->f_extended_header_checksum = true;
        }
      }
    }
  }
  return this->m_extended_header_checksum;
}

Assistant:

uint8_t ami_nvar_t::nvar_entry_body_t::extended_header_checksum() {
    if (f_extended_header_checksum)
        return m_extended_header_checksum;
    n_extended_header_checksum = true;
    if ( ((_parent()->attributes()->valid()) && (_parent()->attributes()->extended_header()) && (extended_header_size() >= ((1 + 1) + 2)) && (extended_header_attributes()->checksum())) ) {
        n_extended_header_checksum = false;
        std::streampos _pos = m__io->pos();
        m__io->seek(((_io()->pos() - 2) - 1));
        m_extended_header_checksum = m__io->read_u1();
        m__io->seek(_pos);
        f_extended_header_checksum = true;
    }
    return m_extended_header_checksum;
}